

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator=(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  int *piVar1;
  Rep *pRVar2;
  undefined8 *puVar3;
  Rep *pRVar4;
  int iVar5;
  int iVar6;
  void **our_elems;
  long lVar7;
  int iVar8;
  long lVar9;
  
  if (this != other) {
    piVar1 = &(this->super_RepeatedPtrFieldBase).current_size_;
    if ((this->super_RepeatedPtrFieldBase).arena_ == (other->super_RepeatedPtrFieldBase).arena_) {
      iVar5 = (this->super_RepeatedPtrFieldBase).current_size_;
      iVar6 = (this->super_RepeatedPtrFieldBase).total_size_;
      pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
      iVar8 = (other->super_RepeatedPtrFieldBase).total_size_;
      pRVar4 = (other->super_RepeatedPtrFieldBase).rep_;
      (this->super_RepeatedPtrFieldBase).current_size_ =
           (other->super_RepeatedPtrFieldBase).current_size_;
      (this->super_RepeatedPtrFieldBase).total_size_ = iVar8;
      (this->super_RepeatedPtrFieldBase).rep_ = pRVar4;
      (other->super_RepeatedPtrFieldBase).current_size_ = iVar5;
      (other->super_RepeatedPtrFieldBase).total_size_ = iVar6;
      (other->super_RepeatedPtrFieldBase).rep_ = pRVar2;
    }
    else {
      lVar7 = (long)*piVar1;
      if (0 < lVar7) {
        pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
        lVar9 = 0;
        do {
          puVar3 = (undefined8 *)pRVar2->elements[lVar9];
          lVar9 = lVar9 + 1;
          puVar3[1] = 0;
          *(undefined1 *)*puVar3 = 0;
        } while (lVar7 != lVar9);
        *piVar1 = 0;
      }
      iVar8 = (other->super_RepeatedPtrFieldBase).current_size_;
      if (iVar8 != 0) {
        pRVar2 = (other->super_RepeatedPtrFieldBase).rep_;
        our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                              (&this->super_RepeatedPtrFieldBase,iVar8);
        internal::RepeatedPtrFieldBase::
        MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&this->super_RepeatedPtrFieldBase,our_elems,pRVar2->elements,iVar8,
                   ((this->super_RepeatedPtrFieldBase).rep_)->allocated_size -
                   (this->super_RepeatedPtrFieldBase).current_size_);
        iVar8 = iVar8 + (this->super_RepeatedPtrFieldBase).current_size_;
        (this->super_RepeatedPtrFieldBase).current_size_ = iVar8;
        pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
        if (pRVar2->allocated_size < iVar8) {
          pRVar2->allocated_size = iVar8;
        }
      }
    }
  }
  return this;
}

Assistant:

inline RepeatedPtrField<Element>& RepeatedPtrField<Element>::operator=(
    RepeatedPtrField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (this->GetArena() != other.GetArena()) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}